

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void AddWindowToRenderList(ImVector<ImDrawList_*> *out_render_list,ImGuiWindow *window)

{
  ImGuiWindow *window_00;
  long lVar1;
  
  AddDrawListToRenderList(out_render_list,window->DrawList);
  if (0 < (window->DC).ChildWindows.Size) {
    lVar1 = 0;
    do {
      window_00 = (window->DC).ChildWindows.Data[lVar1];
      if ((window_00->Active == true) &&
         (((window_00->Flags & 0x2000000) == 0 || (window_00->HiddenFrames < 1)))) {
        AddWindowToRenderList(out_render_list,window_00);
      }
      lVar1 = lVar1 + 1;
    } while (lVar1 < (window->DC).ChildWindows.Size);
  }
  return;
}

Assistant:

static void AddWindowToRenderList(ImVector<ImDrawList*>& out_render_list, ImGuiWindow* window)
{
    AddDrawListToRenderList(out_render_list, window->DrawList);
    for (int i = 0; i < window->DC.ChildWindows.Size; i++)
    {
        ImGuiWindow* child = window->DC.ChildWindows[i];
        if (!child->Active) // clipped children may have been marked not active
            continue;
        if ((child->Flags & ImGuiWindowFlags_Popup) && child->HiddenFrames > 0)
            continue;
        AddWindowToRenderList(out_render_list, child);
    }
}